

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line.cpp
# Opt level: O2

void __thiscall wasm::Options::parse(Options *this,int argc,char **argv)

{
  Arguments AVar1;
  pointer pOVar2;
  bool bVar3;
  __type_conflict _Var4;
  _Alloc_hider _Var5;
  long lVar6;
  ostream *poVar7;
  pointer pcVar8;
  ulong uVar9;
  pointer pOVar10;
  Option *o;
  pointer __lhs;
  string local_b8 [32];
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_98;
  char **local_90;
  undefined1 local_88 [8];
  string currentOption;
  undefined1 local_58 [8];
  string argument;
  
  if (argc < 1) {
    __assert_fail("argc > 0 && \"expect at least program name as an argument\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp"
                  ,0xc0,"void wasm::Options::parse(int, const char **)");
  }
  local_98 = &this->positionalAction;
  uVar9 = 1;
  currentOption.field_2._8_8_ = 0;
  local_90 = argv;
  argument.field_2._8_8_ = this;
  do {
    if (uVar9 == (uint)argc) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,argv[uVar9],(allocator<char> *)local_58);
    for (pcVar8 = (pointer)0x0;
        (_Var5 = currentOption._M_dataplus, currentOption._M_dataplus._M_p != pcVar8 &&
        (_Var5._M_p = pcVar8, *(char *)((long)local_88 + (long)pcVar8) == '-')); pcVar8 = pcVar8 + 1
        ) {
    }
    if ((_Var5._M_p == (pointer)0x0) ||
       (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88,"-"), bVar3)) {
      switch(this->positional) {
      case Zero:
      case Optional:
        poVar7 = std::operator<<((ostream *)&std::cerr,"Unexpected positional argument \'");
        poVar7 = std::operator<<(poVar7,(string *)local_88);
        std::operator<<(poVar7,"\'\n");
        goto LAB_00c8bd9e;
      case One:
        if (currentOption.field_2._8_8_ != 0) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Unexpected second positional argument \'")
          ;
          poVar7 = std::operator<<(poVar7,(string *)local_88);
          poVar7 = std::operator<<(poVar7,"\' for ");
          poVar7 = std::operator<<(poVar7,(string *)(argument.field_2._8_8_ + 0x58));
          std::operator<<(poVar7,'\n');
          goto LAB_00c8bd9e;
        }
      case N:
        std::
        function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(local_98,this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
        currentOption.field_2._8_8_ = currentOption.field_2._8_8_ + 1;
      }
    }
    else {
      local_58 = (undefined1  [8])&argument._M_string_length;
      argument._M_dataplus._M_p = (pointer)0x0;
      argument._M_string_length._0_1_ = 0;
      lVar6 = std::__cxx11::string::find
                        ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_88,0x3d);
      if (lVar6 != -1) {
        std::__cxx11::string::substr((ulong)local_b8,(ulong)local_88);
        std::__cxx11::string::operator=((string *)local_58,local_b8);
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::substr((ulong)local_b8,(ulong)local_88);
        std::__cxx11::string::operator=((string *)local_88,local_b8);
        std::__cxx11::string::~string(local_b8);
        this = (Options *)argument.field_2._8_8_;
      }
      pOVar2 = (this->options).
               super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pOVar10 = (pointer)0x0;
      for (__lhs = (this->options).
                   super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>
                   ._M_impl.super__Vector_impl_data._M_start; argv = local_90, __lhs != pOVar2;
          __lhs = __lhs + 1) {
        _Var4 = std::operator==(&__lhs->longName,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88);
        if ((_Var4) ||
           (_Var4 = std::operator==(&__lhs->shortName,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_88), _Var4)) {
          pOVar10 = __lhs;
        }
      }
      if (pOVar10 == (pointer)0x0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
        poVar7 = std::operator<<(poVar7,(string *)local_88);
        std::operator<<(poVar7,"\'\n");
        goto LAB_00c8bd9e;
      }
      AVar1 = pOVar10->arguments;
      if (AVar1 == N) {
LAB_00c8bcc3:
        if (argument._M_dataplus._M_p == (pointer)0x0) {
          uVar9 = uVar9 + 1;
          if (uVar9 == (uint)argc) {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Couldn\'t find expected argument for \'"
                                    );
            poVar7 = std::operator<<(poVar7,(string *)local_88);
            std::operator<<(poVar7,"\'\n");
LAB_00c8bd9e:
            exit(1);
          }
          std::__cxx11::string::assign(local_58);
        }
      }
      else {
        if (AVar1 == One) {
          if (pOVar10->seen != 0) {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Unexpected second argument \'");
            poVar7 = std::operator<<(poVar7,(string *)local_58);
            poVar7 = std::operator<<(poVar7,"\' for \'");
            poVar7 = std::operator<<(poVar7,(string *)local_88);
            std::operator<<(poVar7,"\'\n");
            goto LAB_00c8bd9e;
          }
          goto LAB_00c8bcc3;
        }
        if ((AVar1 == Zero) && (argument._M_dataplus._M_p != (pointer)0x0)) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Unexpected argument \'");
          poVar7 = std::operator<<(poVar7,(string *)local_58);
          poVar7 = std::operator<<(poVar7,"\' for option \'");
          poVar7 = std::operator<<(poVar7,(string *)local_88);
          std::operator<<(poVar7,"\'\n");
          goto LAB_00c8bd9e;
        }
      }
      this = (Options *)argument.field_2._8_8_;
      std::
      function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&pOVar10->action,(Options *)argument.field_2._8_8_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      pOVar10->seen = pOVar10->seen + 1;
      std::__cxx11::string::~string((string *)local_58);
    }
    std::__cxx11::string::~string((string *)local_88);
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void Options::parse(int argc, const char* argv[]) {

// On Windows, get the wide char version of the command line flags, and convert
// each one to std::string with UTF-8 manually. This means that all paths in
// Binaryen are stored this way on all platforms right up until a library call
// is made to open a file (at which point we use Path::to_path to convert back)
// so that it works with the underlying Win32 APIs.
// Only argList (and not argv) should be used below.
#ifdef USE_WSTRING_PATHS
  LPWSTR* argListW = CommandLineToArgvW(GetCommandLineW(), &argc);
  std::vector<std::string> argList;
  for (size_t i = 0, e = argc; i < e; ++i) {
    argList.push_back(wasm::Path::wstring_to_string(argListW[i]));
  }
#else
  const char** argList = argv;
#endif

  assert(argc > 0 && "expect at least program name as an argument");
  size_t positionalsSeen = 0;
  auto dashes = [](const std::string& s) {
    for (size_t i = 0; i < s.size(); ++i) {
      if (s[i] != '-') {
        return i;
      }
    }
    return s.size();
  };
  for (size_t i = 1, e = argc; i != e; ++i) {
    std::string currentOption = argList[i];

    // "-" alone is a positional option
    if (dashes(currentOption) == 0 || currentOption == "-") {
      // Positional.
      switch (positional) {
        case Arguments::Zero:
          // Optional arguments must use --flag=A format, and not separated by
          // spaces (which would be ambiguous).
        case Arguments::Optional:
          std::cerr << "Unexpected positional argument '" << currentOption
                    << "'\n";
          exit(EXIT_FAILURE);
        case Arguments::One:
          if (positionalsSeen) {
            std::cerr << "Unexpected second positional argument '"
                      << currentOption << "' for " << positionalName << '\n';
            exit(EXIT_FAILURE);
          }
          [[fallthrough]];
        case Arguments::N:
          positionalAction(this, currentOption);
          ++positionalsSeen;
          break;
      }
      continue;
    }

    // Non-positional.
    std::string argument;
    auto equal = currentOption.find_first_of('=');
    if (equal != std::string::npos) {
      argument = currentOption.substr(equal + 1);
      currentOption = currentOption.substr(0, equal);
    }
    Option* option = nullptr;
    for (auto& o : options) {
      if (o.longName == currentOption || o.shortName == currentOption) {
        option = &o;
      }
    }
    if (!option) {
      std::cerr << "Unknown option '" << currentOption << "'\n";
      exit(EXIT_FAILURE);
    }
    switch (option->arguments) {
      case Arguments::Zero:
        if (argument.size()) {
          std::cerr << "Unexpected argument '" << argument << "' for option '"
                    << currentOption << "'\n";
          exit(EXIT_FAILURE);
        }
        break;
      case Arguments::One:
        if (option->seen) {
          std::cerr << "Unexpected second argument '" << argument << "' for '"
                    << currentOption << "'\n";
          exit(EXIT_FAILURE);
        }
        [[fallthrough]];
      case Arguments::N:
        if (!argument.size()) {
          if (i + 1 == e) {
            std::cerr << "Couldn't find expected argument for '"
                      << currentOption << "'\n";
            exit(EXIT_FAILURE);
          }
          argument = argList[++i];
        }
        break;
      case Arguments::Optional:
        break;
    }
    option->action(this, argument);
    ++option->seen;
  }
}